

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicSSOCase2::Setup(BasicSSOCase2 *this)

{
  BasicSSOCase2 *this_local;
  
  this->m_program_ab = 0;
  this->m_program_c = 0;
  this->m_pipeline = 0;
  this->m_storage_buffer = 0;
  this->m_vao = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_program_ab	 = 0;
		m_program_c		 = 0;
		m_pipeline		 = 0;
		m_storage_buffer = 0;
		m_vao			 = 0;
		return NO_ERROR;
	}